

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# utils.hpp
# Opt level: O0

void __thiscall
cpptrace::detail::
optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_0>::swap
          (optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_0>
           *this,optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_0>
                 *other)

{
  optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_0>
  *other_local;
  optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_0>
  *this_local;
  
  if (((this->holds_value & 1U) == 0) || ((other->holds_value & 1U) == 0)) {
    if (((this->holds_value & 1U) == 0) || ((other->holds_value & 1U) != 0)) {
      if (((this->holds_value & 1U) == 0) && ((other->holds_value & 1U) != 0)) {
        std::__cxx11::string::string((string *)this,(string *)other);
        std::__cxx11::string::~string((string *)other);
      }
    }
    else {
      std::__cxx11::string::string((string *)other,(string *)this);
      std::__cxx11::string::~string((string *)this);
    }
  }
  else {
    std::swap<char,std::char_traits<char>,std::allocator<char>>
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)this,
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)other);
  }
  std::swap<bool>(&this->holds_value,&other->holds_value);
  return;
}

Assistant:

void swap(optional& other) noexcept {
            if(holds_value && other.holds_value) {
                std::swap(uvalue, other.uvalue);
            } else if(holds_value && !other.holds_value) {
                new (&other.uvalue) T(std::move(uvalue));
                uvalue.~T();
            } else if(!holds_value && other.holds_value) {
                new (static_cast<void*>(std::addressof(uvalue))) T(std::move(other.uvalue));
                other.uvalue.~T();
            }
            std::swap(holds_value, other.holds_value);
        }